

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O1

Expression * __thiscall
slang::ast::Expression::PropagationVisitor::visit<slang::ast::HierarchicalValueExpression>
          (PropagationVisitor *this,HierarchicalValueExpression *expr)

{
  Type *this_00;
  bool bVar1;
  
  bVar1 = bad((Expression *)expr);
  if (!bVar1) {
    this_00 = this->newType;
    if (this_00->canonical == (Type *)0x0) {
      Type::resolveCanonical(this_00);
    }
    if ((this_00->canonical->super_Symbol).kind == ErrorType) {
      (expr->super_ValueExpressionBase).super_Expression.type.ptr = this->newType;
    }
    else {
      bVar1 = Type::isEquivalent(this->newType,
                                 (expr->super_ValueExpressionBase).super_Expression.type.ptr);
      if (!bVar1) {
        expr = (HierarchicalValueExpression *)
               ConversionExpression::makeImplicit
                         (this->context,this->newType,this->conversionKind,(Expression *)expr,
                          this->parentExpr,this->opRange);
      }
    }
  }
  return (Expression *)expr;
}

Assistant:

Expression& visit(T& expr) {
        if (expr.bad())
            return expr;

        if (newType.isError()) {
            expr.type = &newType;
            return expr;
        }

        // If the new type is equivalent to the old type, there's no need for a
        // conversion. Otherwise if both types are integral or both are real, we have to
        // check if the conversion should be pushed further down the tree. Otherwise we
        // should insert the implicit conversion here.
        bool needConversion = !newType.isEquivalent(*expr.type);
        if constexpr (requires { expr.propagateType(context, newType, opRange, conversionKind); }) {
            if ((newType.isFloating() && expr.type->isFloating()) ||
                (newType.isIntegral() && expr.type->isIntegral()) || newType.isString() ||
                expr.kind == ExpressionKind::ValueRange) {

                if (!needConversion) {
                    // If we don't need a conversion here we still need to call propagateType as
                    // one of our child expressions may still need conversion. However, we shouldn't
                    // pass along our given opRange since we didn't need the conversion here, so our
                    // parent operator isn't relevant. We should try to refigure an opRange for our
                    // most immediate parent expression instead.
                    updateRange(expr);
                }

                if (expr.propagateType(context, newType, opRange, conversionKind)) {
                    // We propagated the type successfully so we don't need a conversion.
                    // We should however clear out any constant value that may have been
                    // stored here, since it may no longer be valid given the new type.
                    needConversion = false;
                    expr.constant = nullptr;
                }
            }
        }

        Expression* result = &expr;
        if (needConversion) {
            result = &ConversionExpression::makeImplicit(context, newType, conversionKind, expr,
                                                         parentExpr, opRange);
        }

        return *result;
    }